

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_test.cc
# Opt level: O0

void __thiscall
leveldb::CacheTest_EntriesArePinned_Test::TestBody(CacheTest_EntriesArePinned_Test *this)

{
  Cache *pCVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  reference pvVar5;
  int k;
  int k_00;
  AssertHelper local_260;
  Message local_258;
  int local_24c;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_10;
  Message local_230;
  int local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_9;
  Message local_208;
  size_type local_200;
  int local_1f4;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_8;
  Message local_1d8;
  size_type local_1d0;
  int local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_7;
  Message local_1a8;
  int local_1a0 [2];
  undefined1 local_198 [8];
  AssertionResult gtest_ar_6;
  Message local_180;
  int local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_5;
  Message local_158;
  int local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_4;
  Message local_130;
  size_type local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_3;
  Message local_100;
  size_type local_f8;
  int local_ec;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_2;
  Message local_d0;
  int local_c8 [2];
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Slice local_90;
  undefined8 local_80;
  Handle *h2;
  AssertHelper local_70;
  Message local_68;
  int local_60 [2];
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  Slice local_28;
  undefined8 local_18;
  Handle *h1;
  CacheTest_EntriesArePinned_Test *this_local;
  
  h1 = (Handle *)this;
  CacheTest::Insert(&this->super_CacheTest,100,0x65,1);
  pCVar1 = (this->super_CacheTest).cache_;
  EncodeKey_abi_cxx11_((string *)&gtest_ar.message_,(leveldb *)0x64,k);
  Slice::Slice(&local_28,(string *)&gtest_ar.message_);
  iVar3 = (*pCVar1->_vptr_Cache[3])(pCVar1,&local_28);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  local_60[1] = 0x65;
  pCVar1 = (this->super_CacheTest).cache_;
  local_18 = CONCAT44(extraout_var,iVar3);
  iVar3 = (*pCVar1->_vptr_Cache[5])(pCVar1,CONCAT44(extraout_var,iVar3));
  local_60[0] = DecodeValue((void *)CONCAT44(extraout_var_00,iVar3));
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_58,"101","DecodeValue(cache_->Value(h1))",local_60 + 1,local_60);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar2) {
    testing::Message::Message(&local_68);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache_test.cc"
               ,0x70,pcVar4);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(&local_68);
  }
  h2._4_4_ = (uint)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  if (h2._4_4_ == 0) {
    CacheTest::Insert(&this->super_CacheTest,100,0x66,1);
    pCVar1 = (this->super_CacheTest).cache_;
    EncodeKey_abi_cxx11_((string *)&gtest_ar_1.message_,(leveldb *)0x64,k_00);
    Slice::Slice(&local_90,(string *)&gtest_ar_1.message_);
    iVar3 = (*pCVar1->_vptr_Cache[3])(pCVar1,&local_90);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    local_c8[1] = 0x66;
    pCVar1 = (this->super_CacheTest).cache_;
    local_80 = CONCAT44(extraout_var_01,iVar3);
    iVar3 = (*pCVar1->_vptr_Cache[5])(pCVar1,CONCAT44(extraout_var_01,iVar3));
    local_c8[0] = DecodeValue((void *)CONCAT44(extraout_var_02,iVar3));
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_c0,"102","DecodeValue(cache_->Value(h2))",local_c8 + 1,local_c8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
    if (!bVar2) {
      testing::Message::Message(&local_d0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache_test.cc"
                 ,0x74,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_d0);
    }
    h2._4_4_ = (uint)!bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
    if (h2._4_4_ == 0) {
      local_ec = 0;
      local_f8 = std::vector<int,_std::allocator<int>_>::size
                           (&(this->super_CacheTest).deleted_keys_);
      testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                ((EqHelper *)local_e8,"0","deleted_keys_.size()",&local_ec,&local_f8);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
      if (!bVar2) {
        testing::Message::Message(&local_100);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache_test.cc"
                   ,0x75,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_100);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_100);
      }
      h2._4_4_ = (uint)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
      if (h2._4_4_ == 0) {
        pCVar1 = (this->super_CacheTest).cache_;
        (*pCVar1->_vptr_Cache[4])(pCVar1,local_18);
        local_11c = 1;
        local_128 = std::vector<int,_std::allocator<int>_>::size
                              (&(this->super_CacheTest).deleted_keys_);
        testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                  ((EqHelper *)local_118,"1","deleted_keys_.size()",&local_11c,&local_128);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
        if (!bVar2) {
          testing::Message::Message(&local_130);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache_test.cc"
                     ,0x78,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_130);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_130);
        }
        h2._4_4_ = (uint)!bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
        if (h2._4_4_ == 0) {
          local_14c = 100;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(this->super_CacheTest).deleted_keys_,0);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_148,"100","deleted_keys_[0]",&local_14c,pvVar5);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
          if (!bVar2) {
            testing::Message::Message(&local_158);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache_test.cc"
                       ,0x79,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_158);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_158);
          }
          h2._4_4_ = (uint)!bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
          if (h2._4_4_ == 0) {
            local_174 = 0x65;
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(this->super_CacheTest).deleted_values_,0);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_170,"101","deleted_values_[0]",&local_174,pvVar5);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
            if (!bVar2) {
              testing::Message::Message(&local_180);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache_test.cc"
                         ,0x7a,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,&local_180);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_180);
            }
            h2._4_4_ = (uint)!bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
            if (h2._4_4_ == 0) {
              CacheTest::Erase(&this->super_CacheTest,100);
              local_1a0[1] = 0xffffffff;
              local_1a0[0] = CacheTest::Lookup(&this->super_CacheTest,100);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_198,"-1","Lookup(100)",local_1a0 + 1,local_1a0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
              if (!bVar2) {
                testing::Message::Message(&local_1a8);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache_test.cc"
                           ,0x7d,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_7.message_,&local_1a8);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_)
                ;
                testing::Message::~Message(&local_1a8);
              }
              h2._4_4_ = (uint)!bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
              if (h2._4_4_ == 0) {
                local_1c4 = 1;
                local_1d0 = std::vector<int,_std::allocator<int>_>::size
                                      (&(this->super_CacheTest).deleted_keys_);
                testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                          ((EqHelper *)local_1c0,"1","deleted_keys_.size()",&local_1c4,&local_1d0);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1c0);
                if (!bVar2) {
                  testing::Message::Message(&local_1d8);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache_test.cc"
                             ,0x7e,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_8.message_,&local_1d8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_);
                  testing::Message::~Message(&local_1d8);
                }
                h2._4_4_ = (uint)!bVar2;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
                if (h2._4_4_ == 0) {
                  pCVar1 = (this->super_CacheTest).cache_;
                  (*pCVar1->_vptr_Cache[4])(pCVar1,local_80);
                  local_1f4 = 2;
                  local_200 = std::vector<int,_std::allocator<int>_>::size
                                        (&(this->super_CacheTest).deleted_keys_);
                  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
                            ((EqHelper *)local_1f0,"2","deleted_keys_.size()",&local_1f4,&local_200)
                  ;
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_1f0);
                  if (!bVar2) {
                    testing::Message::Message(&local_208);
                    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache_test.cc"
                               ,0x81,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_9.message_,&local_208);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_);
                    testing::Message::~Message(&local_208);
                  }
                  h2._4_4_ = (uint)!bVar2;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
                  if (h2._4_4_ == 0) {
                    local_224 = 100;
                    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                       (&(this->super_CacheTest).deleted_keys_,1);
                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                              ((EqHelper *)local_220,"100","deleted_keys_[1]",&local_224,pvVar5);
                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_220);
                    if (!bVar2) {
                      testing::Message::Message(&local_230);
                      pcVar4 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_220);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache_test.cc"
                                 ,0x82,pcVar4);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_10.message_,&local_230);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_);
                      testing::Message::~Message(&local_230);
                    }
                    h2._4_4_ = (uint)!bVar2;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
                    if (h2._4_4_ == 0) {
                      local_24c = 0x66;
                      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                         (&(this->super_CacheTest).deleted_values_,1);
                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                ((EqHelper *)local_248,"102","deleted_values_[1]",&local_24c,pvVar5)
                      ;
                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_248);
                      if (!bVar2) {
                        testing::Message::Message(&local_258);
                        pcVar4 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_248);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_260,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache_test.cc"
                                   ,0x83,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_260,&local_258);
                        testing::internal::AssertHelper::~AssertHelper(&local_260);
                        testing::Message::~Message(&local_258);
                      }
                      h2._4_4_ = (uint)!bVar2;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(CacheTest, EntriesArePinned) {
  Insert(100, 101);
  Cache::Handle* h1 = cache_->Lookup(EncodeKey(100));
  ASSERT_EQ(101, DecodeValue(cache_->Value(h1)));

  Insert(100, 102);
  Cache::Handle* h2 = cache_->Lookup(EncodeKey(100));
  ASSERT_EQ(102, DecodeValue(cache_->Value(h2)));
  ASSERT_EQ(0, deleted_keys_.size());

  cache_->Release(h1);
  ASSERT_EQ(1, deleted_keys_.size());
  ASSERT_EQ(100, deleted_keys_[0]);
  ASSERT_EQ(101, deleted_values_[0]);

  Erase(100);
  ASSERT_EQ(-1, Lookup(100));
  ASSERT_EQ(1, deleted_keys_.size());

  cache_->Release(h2);
  ASSERT_EQ(2, deleted_keys_.size());
  ASSERT_EQ(100, deleted_keys_[1]);
  ASSERT_EQ(102, deleted_values_[1]);
}